

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel_list.c
# Opt level: O3

exr_result_t
exr_attr_chlist_add(exr_context_t ctxt,exr_attr_chlist_t *clist,char *name,exr_pixel_type_t ptype,
                   exr_perceptual_treatment_t islinear,int32_t xsamp,int32_t ysamp)

{
  exr_result_t eVar1;
  size_t sVar2;
  
  if (name == (char *)0x0) {
    if (ctxt != (exr_context_t)0x0) {
      if (clist != (exr_attr_chlist_t *)0x0) {
        eVar1 = (**(code **)(ctxt + 0x48))
                          (ctxt,3,"Channel name must not be empty, received \'%s\'","<NULL>",
                           *(code **)(ctxt + 0x48));
        return eVar1;
      }
      eVar1 = (**(code **)(ctxt + 0x40))
                        (ctxt,3,"Invalid channel list pointer to chlist_add_with_length");
      return eVar1;
    }
    eVar1 = 2;
  }
  else {
    sVar2 = strlen(name);
    eVar1 = exr_attr_chlist_add_with_length
                      (ctxt,clist,name,(int32_t)sVar2,ptype,islinear,xsamp,ysamp);
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_chlist_add (
    exr_context_t              ctxt,
    exr_attr_chlist_t*         clist,
    const char*                name,
    exr_pixel_type_t           ptype,
    exr_perceptual_treatment_t islinear,
    int32_t                    xsamp,
    int32_t                    ysamp)
{
    int32_t len = 0;
    if (name) len = (int32_t) strlen (name);
    return exr_attr_chlist_add_with_length (
        ctxt, clist, name, len, ptype, islinear, xsamp, ysamp);
}